

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

bool __thiscall
QPDFNumberTreeObjectHelper::findObject
          (QPDFNumberTreeObjectHelper *this,numtree_number idx,QPDFObjectHandle *oh)

{
  bool bVar1;
  pointer pTVar2;
  iterator local_88;
  undefined1 local_58 [8];
  iterator i;
  QPDFObjectHandle *oh_local;
  numtree_number idx_local;
  QPDFNumberTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)oh;
  find((iterator *)local_58,this,idx,false);
  end(&local_88,this);
  bVar1 = iterator::operator==((iterator *)local_58,&local_88);
  iterator::~iterator(&local_88);
  if (!bVar1) {
    pTVar2 = iterator::operator->((iterator *)local_58);
    QPDFObjectHandle::operator=
              ((QPDFObjectHandle *)
               i.ivalue.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               &pTVar2->second);
  }
  this_local._7_1_ = !bVar1;
  iterator::~iterator((iterator *)local_58);
  return this_local._7_1_;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::findObject(numtree_number idx, QPDFObjectHandle& oh)
{
    auto i = find(idx);
    if (i == end()) {
        return false;
    }
    oh = i->second;
    return true;
}